

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_construct_const.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  double *pdVar2;
  any a;
  double local_10;
  
  local_10 = 3.14159;
  type::any::any<double>(&a,&local_10);
  pdVar2 = type::any::as<double>(&a);
  dVar1 = *pdVar2;
  if (a._value != (erasure *)0x0) {
    (*(a._value)->_vptr_erasure[1])();
  }
  return -(uint)(dVar1 != 3.14159);
}

Assistant:

int main() {
  try {
    type::any a(3.14159);
    if(a.as<double>() == 3.14159) {
      return 0;
    }
    return -1;
  }
  catch(...) {
    return -1;
  }
}